

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void clip_image_u8_free(clip_image_u8 *img)

{
  pointer puVar1;
  
  if (img != (clip_image_u8 *)0x0) {
    puVar1 = (img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(img->buf).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    operator_delete(img,0x20);
    return;
  }
  return;
}

Assistant:

void clip_image_u8_free(struct clip_image_u8  * img) { if (img) delete img; }